

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::PlatformIsx32(cmMakefile *this)

{
  bool bVar1;
  cmValue __lhs;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_INTERNAL_PLATFORM_ABI",&local_31);
  __lhs = GetDefinition(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if ((__lhs.Value != (string *)0x0) && (bVar1 = std::operator==(__lhs.Value,"ELF X32"), bVar1)) {
    return true;
  }
  return false;
}

Assistant:

bool cmMakefile::PlatformIsx32() const
{
  if (cmValue plat_abi = this->GetDefinition("CMAKE_INTERNAL_PLATFORM_ABI")) {
    if (*plat_abi == "ELF X32") {
      return true;
    }
  }
  return false;
}